

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_get_num_threads(void)

{
  kmp_int32 kVar1;
  
  kVar1 = __kmpc_bound_num_threads((ident_t *)0x1cad3a);
  return kVar1;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_NUM_THREADS)(void) {
#ifdef KMP_STUB
  return 1;
#else
  // __kmpc_bound_num_threads initializes the library if needed
  return __kmpc_bound_num_threads(NULL);
#endif
}